

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  CURLcode CVar1;
  int iVar2;
  time_t tVar3;
  char *__ptr;
  _Bool _Var4;
  per_transfer *per;
  _Bool _Var5;
  _Bool skipped_1;
  _Bool getadded;
  _Bool skipped;
  _Bool local_53;
  _Bool local_52;
  _Bool local_51;
  _Bool *local_50;
  _Bool *local_48;
  CURLM *local_40;
  CURLSH *local_38;
  
  *addedp = false;
  *morep = false;
  local_40 = multi;
  if (all_pers < (long)(ulong)((uint)global->parallel_max * 2)) {
    local_51 = false;
    do {
      CVar1 = create_transfer(global,share,addedp,&local_51);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    } while (local_51 != false);
  }
  if (transfers == (per_transfer *)0x0) {
    _Var4 = false;
  }
  else {
    per = transfers;
    _Var5 = false;
    local_50 = morep;
    local_48 = addedp;
    local_38 = share;
    do {
      if ((long)(ulong)global->parallel_max <= all_added) {
        _Var4 = true;
        morep = local_50;
        break;
      }
      _Var4 = _Var5;
      if ((per->field_0x1d8 & 0x28) == 0) {
        if (per->startat != 0) {
          tVar3 = time((time_t *)0x0);
          _Var4 = true;
          if (tVar3 < per->startat) goto LAB_0011684a;
        }
        per->field_0x1d8 = per->field_0x1d8 | 8;
        CVar1 = pre_transfer(global,per);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        __ptr = (char *)malloc(0x100);
        if (__ptr == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        curl_easy_setopt(per->curl,0xed,(*(ushort *)&global->field_0x63 & 2) == 0);
        curl_easy_setopt(per->curl,0x2777,per);
        curl_easy_setopt(per->curl,0x4efb,xferinfo_cb);
        curl_easy_setopt(per->curl,0x2749,per);
        curl_easy_setopt(per->curl,0x2b,0);
        iVar2 = curl_multi_add_handle(local_40,per->curl);
        if (iVar2 == 0) {
          local_52 = false;
          local_53 = false;
          do {
            CVar1 = create_transfer(global,local_38,&local_52,&local_53);
            if (CVar1 != CURLE_OK) break;
          } while (local_53 != false);
        }
        else {
          CVar1 = CURLE_OUT_OF_MEMORY;
        }
        if (CVar1 != CURLE_OK) {
          free(__ptr);
          return CVar1;
        }
        *__ptr = '\0';
        curl_easy_setopt(per->curl,0x271a,__ptr);
        per->errorbuffer = __ptr;
        per->field_0x1d8 = per->field_0x1d8 | 8;
        all_added = all_added + 1;
        *local_48 = true;
        _Var4 = _Var5;
      }
LAB_0011684a:
      per = per->next;
      morep = local_50;
      _Var5 = _Var4;
    } while (per != (per_transfer *)0x0);
  }
  *morep = _Var4;
  return CURLE_OK;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  char *errorbuf;
  *addedp = FALSE;
  *morep = FALSE;
  if(all_pers < (global->parallel_max*2)) {
    bool skipped = FALSE;
    do {
      result = create_transfer(global, share, addedp, &skipped);
      if(result)
        return result;
    } while(skipped);
  }
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    if(per->added || per->skip)
      /* already added or to be skipped */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }
    per->added = TRUE;

    result = pre_transfer(global, per);
    if(result)
      return result;

    errorbuf = malloc(CURL_ERROR_SIZE);
    if(!errorbuf)
      return CURLE_OUT_OF_MEMORY;

    /* parallel connect means that we do not set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_NOPROGRESS, 0L);
#ifdef DEBUGBUILD
    if(getenv("CURL_FORBID_REUSE"))
      (void)curl_easy_setopt(per->curl, CURLOPT_FORBID_REUSE, 1L);
#endif

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode) {
      DEBUGASSERT(mcode == CURLM_OUT_OF_MEMORY);
      result = CURLE_OUT_OF_MEMORY;
    }

    if(!result) {
      bool getadded = FALSE;
      bool skipped = FALSE;
      do {
        result = create_transfer(global, share, &getadded, &skipped);
        if(result)
          break;
      } while(skipped);
    }
    if(result) {
      free(errorbuf);
      return result;
    }
    errorbuf[0] = 0;
    (void)curl_easy_setopt(per->curl, CURLOPT_ERRORBUFFER, errorbuf);
    per->errorbuffer = errorbuf;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping);
  return CURLE_OK;
}